

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cookmem_02.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  MemSegment *pMVar1;
  MemSegment *pMVar2;
  void *pvVar3;
  size_type sVar4;
  long *plVar5;
  undefined4 *puVar6;
  ostream *poVar7;
  int iVar8;
  ulong userSize;
  bool bVar9;
  MallocArena local_2a0;
  NoActionMemLogger local_298 [8];
  undefined **local_290;
  MallocArena *local_288;
  NoActionMemLogger *local_280;
  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> local_278;
  
  local_2a0.m_minSize = 0x10000;
  local_288 = &local_2a0;
  local_280 = local_298;
  local_278.m_arena = &local_2a0;
  local_278.m_logger = local_298;
  memset(&local_278.m_footprintLimit,0,0x232);
  local_278.m_paddingByte = -0x33;
  local_290 = &PTR__SimpleMemContext_00105d20;
  pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (&local_278,0x1e);
  if (pvVar3 == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mismatch at line ",0x11);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x23);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
LAB_00102622:
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    bVar9 = false;
  }
  else {
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 0x20) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x24);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102622;
    }
    cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
              (&local_278,pvVar3,0);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x26);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102622;
    }
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,300);
    if (pvVar3 == (void *)0x0) {
      iVar8 = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
LAB_001025fd:
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102622;
    }
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 0x130) {
      iVar8 = 0x2a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_001025fd;
    }
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,3000);
    if (pvVar3 == (void *)0x0) {
      iVar8 = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_001025fd;
    }
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 0xbc0) {
      iVar8 = 0x2d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_001025fd;
    }
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    if (pvVar3 == (void *)0x0) {
      iVar8 = 0x2f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_001025fd;
    }
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 30000) {
      iVar8 = 0x30;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_001025fd;
    }
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 30000) {
      iVar8 = 0x32;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_001025fd;
    }
    if (pvVar3 == (void *)0x0) {
      iVar8 = 0x33;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_001025fd;
    }
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 30000) {
      iVar8 = 0x35;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_001025fd;
    }
    bVar9 = true;
    if (pvVar3 == (void *)0x0) {
      iVar8 = 0x36;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_001025fd;
    }
  }
  local_290 = &PTR__MemContext_00105d98;
  pMVar2 = local_278.m_segList;
  while (pMVar2 != (MemSegment *)0x0) {
    pMVar1 = pMVar2->m_next;
    free(pMVar2);
    pMVar2 = pMVar1;
  }
  iVar8 = 0x92;
  if (!bVar9) goto LAB_00102d6a;
  local_2a0.m_minSize = 0x10000;
  local_288 = &local_2a0;
  local_280 = local_298;
  local_278.m_arena = &local_2a0;
  local_278.m_logger = local_298;
  memset(&local_278.m_footprintLimit,0,0x232);
  local_278.m_paddingByte = -0x33;
  local_290 = &PTR__SimpleMemContext_00105d20;
  local_278.m_storingExactSize = true;
  puVar6 = (undefined4 *)
           cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (&local_278,0x1e);
  if (puVar6 == (undefined4 *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mismatch at line ",0x11);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x47);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
LAB_00102a3a:
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    bVar9 = false;
  }
  else {
    *(undefined4 *)((long)puVar6 + 0xe) = 0xffffffff;
    *(undefined4 *)((long)puVar6 + 0x12) = 0xffffffff;
    *(undefined4 *)((long)puVar6 + 0x16) = 0xffffffff;
    *(undefined4 *)((long)puVar6 + 0x1a) = 0xffffffff;
    *puVar6 = 0xffffffff;
    puVar6[1] = 0xffffffff;
    puVar6[2] = 0xffffffff;
    puVar6[3] = 0xffffffff;
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,puVar6);
    if (sVar4 != 0x1e) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x49);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102a3a;
    }
    cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
              (&local_278,puVar6,0);
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,300);
    if (pvVar3 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x4d);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102a3a;
    }
    memset(pvVar3,0xff,300);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 300) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x4f);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102a3a;
    }
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,3000);
    if (pvVar3 == (void *)0x0) {
      iVar8 = 0x52;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
LAB_00102a15:
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102a3a;
    }
    memset(pvVar3,0xff,3000);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 3000) {
      iVar8 = 0x54;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102a15;
    }
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    if (pvVar3 == (void *)0x0) {
      iVar8 = 0x57;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102a15;
    }
    memset(pvVar3,0xff,3000);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 30000) {
      iVar8 = 0x59;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102a15;
    }
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 30000) {
      iVar8 = 0x5c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102a15;
    }
    memset(pvVar3,0xff,30000);
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,30000);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 30000) {
      iVar8 = 0x61;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102a15;
    }
    memset(pvVar3,0xff,30000);
    bVar9 = true;
  }
  local_290 = &PTR__MemContext_00105d98;
  pMVar2 = local_278.m_segList;
  while (pMVar2 != (MemSegment *)0x0) {
    pMVar1 = pMVar2->m_next;
    free(pMVar2);
    pMVar2 = pMVar1;
  }
  iVar8 = 0x93;
  if (!bVar9) goto LAB_00102d6a;
  local_2a0.m_minSize = 0x10000;
  local_288 = &local_2a0;
  local_280 = local_298;
  local_278.m_arena = &local_2a0;
  local_278.m_logger = local_298;
  memset(&local_278.m_footprintLimit,0,0x230);
  local_278.m_storingExactSize = true;
  local_278.m_padding = true;
  local_278.m_paddingByte = -0x33;
  local_290 = &PTR__SimpleMemContext_00105d20;
  puVar6 = (undefined4 *)
           cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (&local_278,0x1e);
  if (puVar6 == (undefined4 *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mismatch at line ",0x11);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x73);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
LAB_00102d28:
    std::ostream::put((char)plVar5);
    std::ostream::flush();
LAB_00102d3b:
    bVar9 = false;
  }
  else {
    *(undefined4 *)((long)puVar6 + 0xe) = 0xffffffff;
    *(undefined4 *)((long)puVar6 + 0x12) = 0xffffffff;
    *(undefined4 *)((long)puVar6 + 0x16) = 0xffffffff;
    *(undefined4 *)((long)puVar6 + 0x1a) = 0xffffffff;
    *puVar6 = 0xffffffff;
    puVar6[1] = 0xffffffff;
    puVar6[2] = 0xffffffff;
    puVar6[3] = 0xffffffff;
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,puVar6);
    if (sVar4 != 0x1e) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x75);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102d28;
    }
    cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
              (&local_278,puVar6,0);
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,300);
    if (pvVar3 == (void *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x79);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102d28;
    }
    memset(pvVar3,0xff,300);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 300) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x7b);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      goto LAB_00102d28;
    }
    pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                       (&local_278,3000);
    if (pvVar3 == (void *)0x0) {
      iVar8 = 0x7e;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
LAB_00102e0c:
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_00102d3b;
    }
    memset(pvVar3,0xff,3000);
    sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (&local_278,pvVar3);
    if (sVar4 != 3000) {
      iVar8 = 0x80;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      goto LAB_00102e0c;
    }
    cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
              (&local_278,pvVar3,0);
    userSize = 30000;
    bVar9 = true;
    do {
      pvVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                         (&local_278,userSize);
      if (pvVar3 == (void *)0x0) {
        iVar8 = 0x86;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Mismatch at line ",0x11);
LAB_00102e63:
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_00102e79;
      }
      memset(pvVar3,0xff,userSize);
      sVar4 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                        (&local_278,pvVar3);
      if (userSize != sVar4) {
        iVar8 = 0x88;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Mismatch at line ",0x11);
        goto LAB_00102e63;
      }
      cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
                (&local_278,pvVar3,0);
      bVar9 = userSize < 0x7543;
      userSize = userSize + 1;
    } while (userSize != 0x7544);
    bVar9 = false;
LAB_00102e79:
    bVar9 = (bool)(bVar9 ^ 1);
  }
  local_290 = &PTR__MemContext_00105d98;
  while (local_278.m_segList != (MemSegment *)0x0) {
    pMVar2 = (local_278.m_segList)->m_next;
    free(local_278.m_segList);
    local_278.m_segList = pMVar2;
  }
  iVar8 = 0x94;
  if (bVar9) {
    return 0;
  }
LAB_00102d6a:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mismatch at line ",0x11)
  ;
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return 1;
}

Assistant:

int
main (int argc, const char* argv[])
{
    ASSERT_EQ (0, test1 ());
    ASSERT_EQ (0, test2 ());
    ASSERT_EQ (0, test3 ());
    return 0;
}